

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

void __thiscall QSystemLocale::~QSystemLocale(QSystemLocale *this)

{
  QSystemLocale *p;
  QSystemLocale *this_local;
  
  this->_vptr_QSystemLocale = (_func_int **)&PTR__QSystemLocale_00be8070;
  if (_systemLocale == this) {
    _systemLocale = this->next;
    systemLocaleData.m_language_id = 0;
  }
  else {
    for (p = _systemLocale; p != (QSystemLocale *)0x0; p = p->next) {
      if (p->next == this) {
        p->next = this->next;
      }
    }
  }
  return;
}

Assistant:

QSystemLocale::~QSystemLocale()
{
    if (_systemLocale == this) {
        _systemLocale = next;

        // Change to system locale => force refresh.
        systemLocaleData.m_language_id = 0;
    } else {
        for (QSystemLocale *p = _systemLocale; p; p = p->next) {
            if (p->next == this)
                p->next = next;
        }
    }
}